

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O2

float __thiscall
Rml::Box::GetSizeAcross(Box *this,BoxDirection direction,BoxArea area_outer,BoxArea area_inner)

{
  code *pcVar1;
  bool bVar2;
  long lVar3;
  float (*pafVar4) [4];
  float fVar5;
  
  if (((area_inner == Auto) || (1 < (int)direction)) || ((int)area_inner < (int)area_outer)) {
    bVar2 = Assert("RMLUI_ASSERT((int)area_outer <= (int)area_inner && (int)direction <= 1 && area_inner != BoxArea::Auto)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                   ,0x65);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  fVar5 = 0.0;
  if (area_inner == Content) {
    fVar5 = *(float *)((long)(this->area_edges + -1) + 8 + (ulong)(direction != Horizontal) * 4);
  }
  lVar3 = (long)(int)area_outer;
  pafVar4 = this->area_edges + lVar3;
  for (; (lVar3 <= (int)area_inner && (lVar3 < 3)); lVar3 = lVar3 + 1) {
    fVar5 = fVar5 + (*pafVar4)[(int)direction] + (*pafVar4)[(int)(direction + 2)];
    pafVar4 = pafVar4 + 1;
  }
  return fVar5;
}

Assistant:

float Box::GetSizeAcross(BoxDirection direction, BoxArea area_outer, BoxArea area_inner) const
{
	static_assert((int)BoxDirection::Horizontal == 1 && (int)BoxDirection::Vertical == 0, "");
	RMLUI_ASSERT((int)area_outer <= (int)area_inner && (int)direction <= 1 && area_inner != BoxArea::Auto);

	float size = 0.0f;

	if (area_inner == BoxArea::Content)
		size = (direction == BoxDirection::Horizontal ? content.x : content.y);

	for (int i = (int)area_outer; i <= (int)area_inner && i < (int)BoxArea::Content; i++)
		size += (area_edges[i][(int)BoxEdge::Top + (int)direction] + area_edges[i][(int)BoxEdge::Bottom + (int)direction]);

	return size;
}